

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessage<std::__cxx11::string,duckdb::PhysicalType>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          PhysicalType params_1)

{
  PhysicalType in_R9B;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  string local_58;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_38;
  
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  ::std::__cxx11::string::string((string *)&local_38,(string *)msg);
  ConstructMessageRecursive<std::__cxx11::string,duckdb::PhysicalType>
            (__return_storage_ptr__,this,&local_58,&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)params & 0xff),in_R9B);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &local_58);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}